

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Shutdown(ImGuiContext *context)

{
  ImGuiContext *ctx;
  ImGuiContext *in_RDI;
  ImGuiContext *backup_context;
  ImGuiContext *g;
  
  if (((in_RDI->IO).Fonts != (ImFontAtlas *)0x0) && ((in_RDI->FontAtlasOwnedByContext & 1U) != 0)) {
    ((in_RDI->IO).Fonts)->Locked = false;
    IM_DELETE<ImFontAtlas>((ImFontAtlas *)0x119065);
  }
  (in_RDI->IO).Fonts = (ImFontAtlas *)0x0;
  ctx = GImGui;
  if ((in_RDI->Initialized & 1U) != 0) {
    if (((in_RDI->SettingsLoaded & 1U) != 0) && ((in_RDI->IO).IniFilename != (char *)0x0)) {
      SetCurrentContext(in_RDI);
      SaveIniSettingsToDisk(&backup_context->Initialized);
      SetCurrentContext(ctx);
    }
    CallContextHooks(context,g._4_4_);
    ImVector<ImGuiWindow_*>::clear_delete((ImVector<ImGuiWindow_*> *)in_RDI);
    ImVector<ImGuiWindow_*>::clear((ImVector<ImGuiWindow_*> *)in_RDI);
    ImVector<ImGuiWindow_*>::clear((ImVector<ImGuiWindow_*> *)in_RDI);
    in_RDI->CurrentWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiWindowStackData>::clear((ImVector<ImGuiWindowStackData> *)in_RDI);
    ImGuiStorage::Clear((ImGuiStorage *)0x11913b);
    in_RDI->NavWindow = (ImGuiWindow *)0x0;
    in_RDI->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    in_RDI->HoveredWindow = (ImGuiWindow *)0x0;
    in_RDI->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
    in_RDI->ActiveIdWindow = (ImGuiWindow *)0x0;
    in_RDI->MovingWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiColorMod>::clear((ImVector<ImGuiColorMod> *)in_RDI);
    ImVector<ImGuiStyleMod>::clear((ImVector<ImGuiStyleMod> *)in_RDI);
    ImVector<ImFont_*>::clear((ImVector<ImFont_*> *)in_RDI);
    ImVector<ImGuiPopupData>::clear((ImVector<ImGuiPopupData> *)in_RDI);
    ImVector<ImGuiPopupData>::clear((ImVector<ImGuiPopupData> *)in_RDI);
    ImVector<ImGuiViewportP_*>::clear_delete((ImVector<ImGuiViewportP_*> *)in_RDI);
    ImPool<ImGuiTabBar>::Clear((ImPool<ImGuiTabBar> *)in_RDI);
    ImVector<ImGuiPtrOrIndex>::clear((ImVector<ImGuiPtrOrIndex> *)in_RDI);
    ImVector<ImGuiShrinkWidthItem>::clear((ImVector<ImGuiShrinkWidthItem> *)in_RDI);
    ImVector<ImGuiListClipperData>::clear_destruct((ImVector<ImGuiListClipperData> *)in_RDI);
    ImPool<ImGuiTable>::Clear((ImPool<ImGuiTable> *)in_RDI);
    ImVector<ImGuiTableTempData>::clear_destruct((ImVector<ImGuiTableTempData> *)in_RDI);
    ImVector<ImDrawChannel>::clear((ImVector<ImDrawChannel> *)in_RDI);
    ImVector<char>::clear((ImVector<char> *)in_RDI);
    ImVector<unsigned_int>::clear((ImVector<unsigned_int> *)in_RDI);
    ImGuiInputTextState::ClearFreeMemory((ImGuiInputTextState *)in_RDI);
    ImChunkStream<ImGuiWindowSettings>::clear((ImChunkStream<ImGuiWindowSettings> *)0x1192bc);
    ImVector<ImGuiSettingsHandler>::clear((ImVector<ImGuiSettingsHandler> *)in_RDI);
    if (in_RDI->LogFile != (ImFileHandle)0x0) {
      if (in_RDI->LogFile != _stdout) {
        ImFileClose((ImFileHandle)0x119305);
      }
      in_RDI->LogFile = (ImFileHandle)0x0;
    }
    ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x119326);
    in_RDI->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown(ImGuiContext* context)
{
    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    ImGuiContext& g = *context;
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
    {
        g.IO.Fonts->Locked = false;
        IM_DELETE(g.IO.Fonts);
    }
    g.IO.Fonts = NULL;

    // Cleanup of other data are conditional on actually having initialized Dear ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded && g.IO.IniFilename != NULL)
    {
        ImGuiContext* backup_context = GImGui;
        SetCurrentContext(&g);
        SaveIniSettingsToDisk(g.IO.IniFilename);
        SetCurrentContext(backup_context);
    }

    CallContextHooks(&g, ImGuiContextHookType_Shutdown);

    // Clear everything else
    g.Windows.clear_delete();
    g.WindowsFocusOrder.clear();
    g.WindowsTempSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;
    g.ActiveIdWindow = g.ActiveIdPreviousFrameWindow = NULL;
    g.MovingWindow = NULL;
    g.ColorStack.clear();
    g.StyleVarStack.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.BeginPopupStack.clear();

    g.Viewports.clear_delete();

    g.TabBars.Clear();
    g.CurrentTabBarStack.clear();
    g.ShrinkWidthBuffer.clear();

    g.ClipperTempData.clear_destruct();

    g.Tables.Clear();
    g.TablesTempData.clear_destruct();
    g.DrawChannelsTempMergeBuffer.clear();

    g.ClipboardHandlerData.clear();
    g.MenusIdSubmittedThisFrame.clear();
    g.InputTextState.ClearFreeMemory();

    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile)
    {
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        if (g.LogFile != stdout)
#endif
            ImFileClose(g.LogFile);
        g.LogFile = NULL;
    }
    g.LogBuffer.clear();

    g.Initialized = false;
}